

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  OneofDescriptor *pOVar6;
  Message **ppMVar7;
  undefined8 uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MessageFactory *in_RCX;
  Reflection *in_RDX;
  Reflection *in_RSI;
  Reflection *in_RDI;
  FieldDescriptor *in_stack_00000010;
  Message *in_stack_00000018;
  Message *default_message_1;
  Message *default_message;
  Message **result_holder;
  Message *result;
  MessageFactory *in_stack_000000c8;
  FieldDescriptor *in_stack_000000d0;
  ExtensionSet *in_stack_000000d8;
  FieldDescriptor *in_stack_ffffffffffffff98;
  Message *pMVar9;
  Reflection *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffa8;
  Message *in_stack_ffffffffffffffb8;
  Reflection *in_stack_ffffffffffffffc0;
  Message **local_38;
  OneofDescriptor *in_stack_ffffffffffffffd0;
  MessageLite *local_8;
  
  pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)in_RDX);
  if (pDVar5 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              ((Descriptor *)factory,(FieldDescriptor *)CONCAT44(result._4_4_,result._0_4_),
               (char *)result_holder,(char *)default_message);
  }
  LVar2 = FieldDescriptor::label((FieldDescriptor *)in_RDX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              ((Descriptor *)factory,(FieldDescriptor *)CONCAT44(result._4_4_,result._0_4_),
               (char *)result_holder,(char *)default_message);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x42279f);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              ((Descriptor *)message,field,(char *)factory,result._4_4_);
  }
  if (in_RCX == (MessageFactory *)0x0) {
    in_RCX = in_RDI->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffffa0,(Message *)in_stack_ffffffffffffff98);
    local_8 = internal::ExtensionSet::MutableMessage
                        (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  }
  else {
    local_38 = MutableRaw<google::protobuf::Message*>
                         (in_RDI,in_stack_ffffffffffffffa8,
                          (FieldDescriptor *)in_stack_ffffffffffffffa0);
    pOVar6 = FieldDescriptor::containing_oneof((FieldDescriptor *)in_RDX);
    if (pOVar6 == (OneofDescriptor *)0x0) {
      SetBit((Reflection *)default_message_1,in_stack_00000018,in_stack_00000010);
    }
    else {
      bVar1 = HasOneofField(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                            (FieldDescriptor *)in_RDI);
      if (!bVar1) {
        in_stack_ffffffffffffffa0 = in_RSI;
        FieldDescriptor::containing_oneof((FieldDescriptor *)in_RDX);
        ClearOneof(in_RDX,(Message *)in_RCX,in_stack_ffffffffffffffd0);
        local_38 = MutableField<google::protobuf::Message*>
                             (in_RDI,in_stack_ffffffffffffffa8,
                              (FieldDescriptor *)in_stack_ffffffffffffffa0);
        ppMVar7 = DefaultRaw<google::protobuf::Message_const*>
                            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        pMVar9 = *ppMVar7;
        uVar8 = (**(code **)(in_RSI->descriptor_ + 0x28))();
        iVar4 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[4])(pMVar9,uVar8);
        *local_38 = (Message *)CONCAT44(extraout_var,iVar4);
      }
    }
    if (*local_38 == (Message *)0x0) {
      ppMVar7 = DefaultRaw<google::protobuf::Message_const*>
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      pMVar9 = *ppMVar7;
      uVar8 = (**(code **)(in_RSI->descriptor_ + 0x28))();
      iVar4 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[4])(pMVar9,uVar8);
      *local_38 = (Message *)CONCAT44(extraout_var_00,iVar4);
    }
    local_8 = &(*local_38)->super_MessageLite;
  }
  return (Message *)local_8;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (field->containing_oneof()) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}